

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode addReference(UA_Server *server,UA_Session *session,UA_AddReferencesItem *item)

{
  UA_StatusCode UVar1;
  UA_NodeId local_118;
  undefined8 local_100;
  size_t sStack_f8;
  UA_Byte *local_f0;
  ulong local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  size_t local_c8;
  UA_Byte *pUStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  UA_DeleteReferencesItem deleteItem;
  
  UVar1 = 0x80400000;
  if ((item->targetServerUri).length == 0) {
    UVar1 = UA_Server_editNode(server,session,&item->sourceNodeId,addOneWayReference,item);
    if (UVar1 == 0) {
      local_118.identifier.string.data = (item->targetNodeId).nodeId.identifier.string.data;
      local_118.namespaceIndex = (item->targetNodeId).nodeId.namespaceIndex;
      local_118._2_2_ = *(undefined2 *)&(item->targetNodeId).nodeId.field_0x2;
      local_118.identifierType = (item->targetNodeId).nodeId.identifierType;
      local_118.identifier.string.length = (item->targetNodeId).nodeId.identifier.string.length;
      uStack_e0 = 0;
      local_d8 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_f0 = (item->referenceTypeId).identifier.string.data;
      local_100._0_2_ = (item->referenceTypeId).namespaceIndex;
      local_100._2_2_ = *(undefined2 *)&(item->referenceTypeId).field_0x2;
      local_100._4_4_ = (item->referenceTypeId).identifierType;
      sStack_f8 = (item->referenceTypeId).identifier.string.length;
      local_e8 = (ulong)item->isForward ^ 1;
      pUStack_c0 = (item->sourceNodeId).identifier.string.data;
      uStack_d0._0_2_ = (item->sourceNodeId).namespaceIndex;
      uStack_d0._2_2_ = *(undefined2 *)&(item->sourceNodeId).field_0x2;
      uStack_d0._4_4_ = (item->sourceNodeId).identifierType;
      local_c8 = (item->sourceNodeId).identifier.string.length;
      UVar1 = UA_Server_editNode(server,session,&local_118,addOneWayReference,&local_118);
      if (UVar1 != 0) {
        deleteItem.sourceNodeId.identifier.string.length =
             (size_t)(item->sourceNodeId).identifier.string.data;
        uStack_98._0_2_ = (item->sourceNodeId).namespaceIndex;
        uStack_98._2_2_ = *(undefined2 *)&(item->sourceNodeId).field_0x2;
        uStack_98._4_4_ = (item->sourceNodeId).identifierType;
        deleteItem.sourceNodeId._0_8_ = (item->sourceNodeId).identifier.string.length;
        deleteItem.sourceNodeId.identifier.string.data =
             (UA_Byte *)*(undefined8 *)&item->referenceTypeId;
        deleteItem.referenceTypeId._0_8_ = (item->referenceTypeId).identifier.string.length;
        deleteItem.referenceTypeId.identifier.string.length =
             (size_t)(item->referenceTypeId).identifier.string.data;
        deleteItem.referenceTypeId.identifier.guid.data4[0] = item->isForward;
        deleteItem._48_8_ = *(undefined8 *)&(item->targetNodeId).nodeId;
        deleteItem.targetNodeId.nodeId._0_8_ = (item->targetNodeId).nodeId.identifier.string.length;
        deleteItem.targetNodeId.nodeId.identifier.string.length =
             (size_t)(item->targetNodeId).nodeId.identifier.string.data;
        deleteItem.targetNodeId.nodeId.identifier.string.data =
             (UA_Byte *)(item->targetNodeId).namespaceUri.length;
        deleteItem.targetNodeId.namespaceUri.length = (size_t)(item->targetNodeId).namespaceUri.data
        ;
        deleteItem.targetNodeId.namespaceUri.data = *(UA_Byte **)&(item->targetNodeId).serverIndex;
        deleteItem.targetNodeId.serverIndex._0_1_ = 0;
        UA_Server_editNode(server,session,&item->sourceNodeId,deleteOneWayReference,&uStack_98);
      }
    }
  }
  return UVar1;
}

Assistant:

static UA_StatusCode
addReference(UA_Server *server, UA_Session *session,
             const UA_AddReferencesItem *item) {
    /* Currently no expandednodeids are allowed */
    if(item->targetServerUri.length > 0)
        return UA_STATUSCODE_BADNOTIMPLEMENTED;

    /* Add the first direction */
#ifndef UA_ENABLE_EXTERNAL_NAMESPACES
    UA_StatusCode retval = UA_Server_editNode(server, session, &item->sourceNodeId,
                                              (UA_EditNodeCallback)addOneWayReference,
                                              item);
#else
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    UA_Boolean handledExternally = UA_FALSE;
    for(size_t j = 0; j <server->externalNamespacesSize; ++j) {
        if(item->sourceNodeId.namespaceIndex != server->externalNamespaces[j].index) {
            continue;
        } else {
            UA_ExternalNodeStore *ens = &server->externalNamespaces[j].externalNodeStore;
            retval = (UA_StatusCode)ens->addOneWayReference(ens->ensHandle, item);
            handledExternally = UA_TRUE;
            break;
        }
    }
    if(!handledExternally)
        retval = UA_Server_editNode(server, session, &item->sourceNodeId,
                                    (UA_EditNodeCallback)addOneWayReference, item);
#endif

    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* Add the second direction */
    UA_AddReferencesItem secondItem;
    UA_AddReferencesItem_init(&secondItem);
    secondItem.sourceNodeId = item->targetNodeId.nodeId;
    secondItem.referenceTypeId = item->referenceTypeId;
    secondItem.isForward = !item->isForward;
    secondItem.targetNodeId.nodeId = item->sourceNodeId;
    /* keep default secondItem.targetNodeClass = UA_NODECLASS_UNSPECIFIED */
#ifndef UA_ENABLE_EXTERNAL_NAMESPACES
    retval = UA_Server_editNode(server, session, &secondItem.sourceNodeId,
                                (UA_EditNodeCallback)addOneWayReference, &secondItem);
#else
    handledExternally = UA_FALSE;
    for(size_t j = 0; j < server->externalNamespacesSize; ++j) {
        if(secondItem.sourceNodeId.namespaceIndex != server->externalNamespaces[j].index) {
            continue;
        } else {
            UA_ExternalNodeStore *ens = &server->externalNamespaces[j].externalNodeStore;
            retval = (UA_StatusCode)ens->addOneWayReference(ens->ensHandle, &secondItem);
            handledExternally = UA_TRUE;
            break;
        }
    }
    if(!handledExternally)
        retval = UA_Server_editNode(server, session, &secondItem.sourceNodeId,
                                    (UA_EditNodeCallback)addOneWayReference, &secondItem);
#endif

    /* remove reference if the second direction failed */
    if(retval != UA_STATUSCODE_GOOD) {
        UA_DeleteReferencesItem deleteItem;
        deleteItem.sourceNodeId = item->sourceNodeId;
        deleteItem.referenceTypeId = item->referenceTypeId;
        deleteItem.isForward = item->isForward;
        deleteItem.targetNodeId = item->targetNodeId;
        deleteItem.deleteBidirectional = false;
        /* ignore returned status code */
        UA_Server_editNode(server, session, &item->sourceNodeId,
                           (UA_EditNodeCallback)deleteOneWayReference, &deleteItem);
    }
    return retval;
}